

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O2

int pt_tcal_header_cbr(pt_time_cal *tcal,pt_packet_cbr *packet,pt_config *config)

{
  int iVar1;
  
  if (config == (pt_config *)0x0 || (packet == (pt_packet_cbr *)0x0 || tcal == (pt_time_cal *)0x0))
  {
    iVar1 = -1;
  }
  else {
    if (config->nom_freq == 0) {
      return 0;
    }
    if (packet->ratio != 0) {
      iVar1 = pt_tcal_set_fcr(tcal,(ulong)(ushort)((ushort)((ushort)config->nom_freq << 8) /
                                                  (ushort)packet->ratio));
      return iVar1;
    }
    iVar1 = -5;
  }
  return iVar1;
}

Assistant:

int pt_tcal_header_cbr(struct pt_time_cal *tcal,
		      const struct pt_packet_cbr *packet,
		      const struct pt_config *config)
{
	uint64_t cbr, p1, fcr;

	if (!tcal || !packet || !config)
		return -pte_internal;

	p1 = config->nom_freq;
	if (!p1)
		return 0;

	/* If we know the nominal frequency, we can use it for calibration. */
	cbr = packet->ratio;
	if (!cbr)
		return -pte_bad_packet;

	fcr = (p1 << pt_tcal_fcr_shr) / cbr;

	return pt_tcal_set_fcr(tcal, fcr);
}